

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O3

bool __thiscall Rml::Element::SetProperty(Element *this,String *name,String *value)

{
  NodePtr pDVar1;
  ulong uVar2;
  ulong *puVar3;
  bool bVar4;
  PropertyMap *this_00;
  ulong uVar5;
  pair<Rml::PropertyId,_Rml::Property> *property;
  NodePtr pDVar6;
  uint8_t *puVar7;
  ulong *puVar8;
  const_iterator cVar9;
  PropertyDictionary properties;
  Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
  TStack_58;
  
  PropertyDictionary::PropertyDictionary((PropertyDictionary *)&TStack_58);
  bVar4 = StyleSheetSpecification::ParsePropertyDeclaration
                    ((PropertyDictionary *)&TStack_58,name,value);
  if (bVar4) {
    this_00 = PropertyDictionary::GetProperties((PropertyDictionary *)&TStack_58);
    cVar9 = robin_hood::detail::
            Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
            ::cbegin(this_00);
    pDVar1 = (NodePtr)this_00->mInfo;
    if (cVar9.mKeyVals == pDVar1) {
      bVar4 = true;
    }
    else {
      do {
        puVar7 = cVar9.mInfo;
        pDVar6 = cVar9.mKeyVals;
        bVar4 = ElementStyle::SetProperty
                          (&this->meta->style,(pDVar6->mData).first,&(pDVar6->mData).second);
        if (!bVar4) {
          bVar4 = false;
          break;
        }
        pDVar6 = pDVar6 + 1;
        uVar5 = *(ulong *)(puVar7 + 1);
        if (uVar5 == 0) {
          puVar3 = (ulong *)(puVar7 + 9);
          do {
            puVar8 = puVar3;
            pDVar6 = pDVar6 + 8;
            uVar5 = *puVar8;
            puVar3 = puVar8 + 1;
          } while (uVar5 == 0);
        }
        else {
          puVar8 = (ulong *)(puVar7 + 1);
        }
        uVar2 = 0;
        if (uVar5 != 0) {
          for (; (uVar5 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        uVar5 = uVar2 >> 3 & 0x1fffffff;
        cVar9.mInfo = (uint8_t *)((long)puVar8 + uVar5);
        cVar9.mKeyVals = pDVar6 + uVar5;
      } while (pDVar6 + uVar5 != pDVar1);
    }
  }
  else {
    bVar4 = false;
    Log::Message(LT_WARNING,"Syntax error parsing inline property declaration \'%s: %s;\'.",
                 (name->_M_dataplus)._M_p,(value->_M_dataplus)._M_p);
  }
  robin_hood::detail::
  Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
  ::destroy(&TStack_58);
  return bVar4;
}

Assistant:

bool Element::SetProperty(const String& name, const String& value)
{
	// The name may be a shorthand giving us multiple underlying properties
	PropertyDictionary properties;
	if (!StyleSheetSpecification::ParsePropertyDeclaration(properties, name, value))
	{
		Log::Message(Log::LT_WARNING, "Syntax error parsing inline property declaration '%s: %s;'.", name.c_str(), value.c_str());
		return false;
	}
	for (auto& property : properties.GetProperties())
	{
		if (!meta->style.SetProperty(property.first, property.second))
			return false;
	}
	return true;
}